

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZHybridizeHDiv.cpp
# Opt level: O0

tuple<TPZCompMesh_*,_TPZVec<TPZCompMesh_*>_> * __thiscall
TPZHybridizeHDiv::Hybridize
          (TPZHybridizeHDiv *this,TPZCompMesh *cmesh_HDiv,TPZVec<TPZCompMesh_*> *meshvec_HDiv,
          bool group_elements,double Lagrange_term_multiplier)

{
  int64_t iVar1;
  TPZCompMesh *__in;
  TPZVec<TPZCompMesh_*> *in_RCX;
  TPZCompMesh *in_RSI;
  TPZManVector<TPZCompMesh_*,_3> *in_RDI;
  byte in_R8B;
  TPZCompMesh *in_stack_00000020;
  TPZCompMesh *cmesh_Hybrid;
  int i;
  TPZManVector<TPZCompMesh_*,_3> meshvec_Hybrid;
  TPZVec<TPZCompMesh_*> *in_stack_00000280;
  TPZCompMesh *in_stack_00000288;
  TPZHybridizeHDiv *in_stack_00000290;
  TPZManVector<TPZCompMesh_*,_3> *in_stack_fffffffffffffef0;
  TPZCompMesh *in_stack_fffffffffffffef8;
  TPZCompMesh *in_stack_ffffffffffffff00;
  TPZCompMesh **in_stack_ffffffffffffff10;
  TPZManVector<TPZCompMesh_*,_3> *this_00;
  TPZHybridizeHDiv *in_stack_ffffffffffffff30;
  TPZVec<TPZCompMesh_*> *in_stack_ffffffffffffff48;
  TPZHybridizeHDiv *in_stack_ffffffffffffff50;
  TPZVec<TPZCompMesh_*> *in_stack_ffffffffffffff68;
  TPZHybridizeHDiv *in_stack_ffffffffffffff70;
  int local_74;
  TPZVec<TPZCompMesh_*> local_68 [2];
  byte local_21;
  TPZVec<TPZCompMesh_*> *local_20;
  
  local_21 = in_R8B & 1;
  this_00 = in_RDI;
  local_20 = in_RCX;
  TPZVec<TPZCompMesh_*>::size(in_RCX);
  TPZManVector<TPZCompMesh_*,_3>::TPZManVector(this_00,(int64_t)in_RDI,in_stack_ffffffffffffff10);
  local_74 = 0;
  while( true ) {
    iVar1 = TPZVec<TPZCompMesh_*>::size(local_20);
    if (iVar1 <= local_74) break;
    in_stack_ffffffffffffff00 =
         (TPZCompMesh *)TPZVec<TPZCompMesh_*>::operator[](local_20,(long)local_74);
    in_stack_fffffffffffffef8 = TPZCompMesh::Clone(in_stack_ffffffffffffff00);
    in_stack_fffffffffffffef0 =
         (TPZManVector<TPZCompMesh_*,_3> *)
         TPZVec<TPZCompMesh_*>::operator[](local_68,(long)local_74);
    (in_stack_fffffffffffffef0->super_TPZVec<TPZCompMesh_*>)._vptr_TPZVec =
         (_func_int **)in_stack_fffffffffffffef8;
    local_74 = local_74 + 1;
  }
  ComputePeriferalMaterialIds(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  ComputeNState((TPZHybridizeHDiv *)in_stack_ffffffffffffff00,
                (TPZVec<TPZCompMesh_*> *)in_stack_fffffffffffffef8);
  InsertPeriferalMaterialObjects(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  HybridizeInternalSides
            ((TPZHybridizeHDiv *)meshvec_Hybrid.fExtAlloc[0],
             (TPZVec<TPZCompMesh_*> *)meshvec_Hybrid.super_TPZVec<TPZCompMesh_*>.fNAlloc);
  __in = CreateMultiphysicsMesh
                   (in_stack_ffffffffffffff30,in_RSI,&this_00->super_TPZVec<TPZCompMesh_*>,
                    (double)in_RDI);
  CreateInterfaceElements(in_stack_00000290,in_stack_00000288,in_stack_00000280);
  if ((local_21 & 1) != 0) {
    GroupandCondenseElements(in_stack_00000020);
  }
  std::make_tuple<TPZCompMesh*&,TPZManVector<TPZCompMesh*,3>&>
            ((TPZCompMesh **)in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  std::tuple<TPZCompMesh_*,_TPZVec<TPZCompMesh_*>_>::
  tuple<TPZCompMesh_*,_TPZManVector<TPZCompMesh_*,_3>,_true>
            ((tuple<TPZCompMesh_*,_TPZVec<TPZCompMesh_*>_> *)in_stack_fffffffffffffef0,
             (tuple<TPZCompMesh_*,_TPZManVector<TPZCompMesh_*,_3>_> *)__in);
  std::tuple<TPZCompMesh_*,_TPZManVector<TPZCompMesh_*,_3>_>::~tuple
            ((tuple<TPZCompMesh_*,_TPZManVector<TPZCompMesh_*,_3>_> *)0x1f584d1);
  TPZManVector<TPZCompMesh_*,_3>::~TPZManVector(in_stack_fffffffffffffef0);
  return (tuple<TPZCompMesh_*,_TPZVec<TPZCompMesh_*>_> *)this_00;
}

Assistant:

std::tuple<TPZCompMesh*, TPZVec<TPZCompMesh*> > TPZHybridizeHDiv::Hybridize(TPZCompMesh* cmesh_HDiv, TPZVec<TPZCompMesh*>& meshvec_HDiv, bool group_elements, double Lagrange_term_multiplier /* = 1. */) {
    TPZManVector<TPZCompMesh *, 3> meshvec_Hybrid(meshvec_HDiv.size(), 0);
    for (int i = 0; i < meshvec_HDiv.size(); i++) {
        meshvec_Hybrid[i] = meshvec_HDiv[i]->Clone();
    }
    ComputePeriferalMaterialIds(meshvec_Hybrid);
    ComputeNState(meshvec_Hybrid);
    /// insert the material objects for HDivWrap and LagrangeInterface
    InsertPeriferalMaterialObjects(meshvec_Hybrid);
    HybridizeInternalSides(meshvec_Hybrid);
    TPZCompMesh *cmesh_Hybrid = CreateMultiphysicsMesh(cmesh_HDiv, meshvec_Hybrid, Lagrange_term_multiplier);
    CreateInterfaceElements(cmesh_Hybrid, meshvec_Hybrid);
    if (group_elements){
        GroupandCondenseElements(cmesh_Hybrid);
    }
    return std::make_tuple(cmesh_Hybrid, meshvec_Hybrid);
}